

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void end_examples<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  float *pfVar1;
  _Hash_node_base *p_Var2;
  size_t i;
  ulong uVar3;
  __node_base *p_Var4;
  float fVar5;
  
  p_Var4 = &(weights->_map)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    pfVar1 = (l->decay_levels)._end;
    fVar5 = expf(pfVar1[-1] -
                 pfVar1[(int)((double)*(float *)((long)&(*(_Hash_node_base **)
                                                          &((_Prime_rehash_policy *)(p_Var4 + 2))->
                                                           _M_max_load_factor)->_M_nxt +
                                                (ulong)l->all->lda * 4) + (-1.0 - l->example_t))]);
    if (1.0 <= fVar5) {
      fVar5 = 1.0;
    }
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    for (uVar3 = 0; uVar3 < l->all->lda; uVar3 = uVar3 + 1) {
      *(float *)((long)&p_Var2->_M_nxt + uVar3 * 4) =
           *(float *)((long)&p_Var2->_M_nxt + uVar3 * 4) * fVar5;
    }
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}